

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

Abc_Cex_t * Abc_CexPermute(Abc_Cex_t *p,Vec_Int_t *vMapOld2New)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Cex_t *__s;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  iVar1 = vMapOld2New->nSize;
  iVar2 = p->nPis;
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vMapOld2New) == p->nPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1eb,"Abc_Cex_t *Abc_CexPermute(Abc_Cex_t *, Vec_Int_t *)");
  }
  iVar3 = p->iFrame;
  iVar4 = p->nRegs;
  uVar6 = (iVar3 + 1) * iVar2 + iVar4;
  __size = (long)(int)((((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0)) * 4 + 0x14;
  __s = (Abc_Cex_t *)malloc(__size);
  iVar7 = 0;
  memset(__s,0,__size);
  __s->nRegs = iVar4;
  __s->nPis = iVar2;
  __s->nBits = uVar6;
  __s->iPo = p->iPo;
  __s->iFrame = iVar3;
  iVar3 = p->nBits;
  if (iVar4 < iVar3) {
    do {
      uVar6 = iVar4 + iVar7;
      if (((uint)(&p[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
        iVar5 = (int)((long)iVar7 % (long)iVar2);
        if ((iVar5 < 0) || (iVar1 <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (uVar6 - iVar5) + vMapOld2New->pArray[(long)iVar7 % (long)iVar2 & 0xffffffff];
        (&__s[1].iPo)[iVar5 >> 5] = (&__s[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
      iVar7 = iVar7 + 1;
    } while (iVar3 - iVar4 != iVar7);
  }
  return __s;
}

Assistant:

Abc_Cex_t * Abc_CexPermute( Abc_Cex_t * p, Vec_Int_t * vMapOld2New )
{
    Abc_Cex_t * pCex;
    int i, iNew;
    assert( Vec_IntSize(vMapOld2New) == p->nPis );
    pCex = Abc_CexAlloc( p->nRegs, p->nPis, p->iFrame+1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( i = p->nRegs; i < p->nBits; i++ )
        if ( Abc_InfoHasBit(p->pData, i) )
        {
            iNew = p->nRegs + p->nPis * ((i - p->nRegs) / p->nPis) + Vec_IntEntry( vMapOld2New, (i - p->nRegs) % p->nPis );
            Abc_InfoSetBit( pCex->pData, iNew );
        }
    return pCex;
}